

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_key.cpp
# Opt level: O0

PrivkeyHexDataStruct *
cfd::js::api::KeyStructApi::GetPrivkeyFromWif
          (PrivkeyHexDataStruct *__return_storage_ptr__,PrivkeyWifDataStruct *request)

{
  PrivkeyWifDataStruct *this;
  string *in_R8;
  allocator local_151;
  function<cfd::js::api::PrivkeyHexDataStruct_(const_cfd::js::api::PrivkeyWifDataStruct_&)>
  local_150;
  undefined1 local_130 [278];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  PrivkeyWifDataStruct *pPStack_18;
  anon_class_1_0_00000001 call_func;
  PrivkeyWifDataStruct *request_local;
  PrivkeyHexDataStruct *result;
  
  local_1a = 0;
  pPStack_18 = request;
  PrivkeyHexDataStruct::PrivkeyHexDataStruct(__return_storage_ptr__);
  this = pPStack_18;
  std::function<cfd::js::api::PrivkeyHexDataStruct(cfd::js::api::PrivkeyWifDataStruct_const&)>::
  function<cfd::js::api::KeyStructApi::GetPrivkeyFromWif(cfd::js::api::PrivkeyWifDataStruct_const&)::__0&,void>
            ((function<cfd::js::api::PrivkeyHexDataStruct(cfd::js::api::PrivkeyWifDataStruct_const&)>
              *)local_130,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150,"GetPrivkeyFromWif",&local_151);
  ExecuteStructApi<cfd::js::api::PrivkeyWifDataStruct,cfd::js::api::PrivkeyHexDataStruct>
            ((PrivkeyHexDataStruct *)(local_130 + 0x20),(api *)this,
             (PrivkeyWifDataStruct *)local_130,&local_150,in_R8);
  PrivkeyHexDataStruct::operator=(__return_storage_ptr__,(PrivkeyHexDataStruct *)(local_130 + 0x20))
  ;
  PrivkeyHexDataStruct::~PrivkeyHexDataStruct((PrivkeyHexDataStruct *)(local_130 + 0x20));
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::function<cfd::js::api::PrivkeyHexDataStruct_(const_cfd::js::api::PrivkeyWifDataStruct_&)>::
  ~function((function<cfd::js::api::PrivkeyHexDataStruct_(const_cfd::js::api::PrivkeyWifDataStruct_&)>
             *)local_130);
  return __return_storage_ptr__;
}

Assistant:

PrivkeyHexDataStruct KeyStructApi::GetPrivkeyFromWif(
    const PrivkeyWifDataStruct& request) {
  auto call_func =
      [](const PrivkeyWifDataStruct& request) -> PrivkeyHexDataStruct {
    PrivkeyHexDataStruct response;

    NetType net_type = NetType::kMainnet;
    KeyApi api;
    Privkey privkey =
        api.GetPrivkeyFromWif(request.wif, &net_type, &response.is_compressed);
    response.hex = privkey.GetHex();
    response.network = AddressStructApi::ConvertNetTypeString(net_type);
    return response;
  };

  PrivkeyHexDataStruct result;
  result = ExecuteStructApi<PrivkeyWifDataStruct, PrivkeyHexDataStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}